

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O2

int Pdr_ManPushClauses(Pdr_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *p_00;
  Pdr_Set_t *pPVar6;
  Pdr_Set_t *pPVar7;
  void *pvVar8;
  abctime aVar9;
  int iVar10;
  uint i;
  int iVar11;
  uint i_00;
  _func_int_varargs *p_Var12;
  
  if (p->pPars->fShiftStart == 0) {
    p_Var12 = (_func_int_varargs *)0x1;
  }
  else {
    p_Var12 = (_func_int_varargs *)(ulong)(uint)p->iUseFrame;
  }
  iVar1 = p->vSolvers->nSize;
  aVar4 = Abc_Clock();
  if (p->iUseFrame < 1) {
    __assert_fail("p->iUseFrame > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrCore.c"
                  ,0x9d,"int Pdr_ManPushClauses(Pdr_Man_t *)");
  }
  i = iVar1 - 1;
  iVar1 = 0;
  do {
    iVar3 = (int)p_Var12;
    if ((int)i <= iVar3) {
      p_Var12 = (_func_int_varargs *)(ulong)i;
      pVVar5 = Vec_VecEntry(p->vClauses,i);
      Vec_PtrSort(pVVar5,p_Var12);
      iVar3 = pVVar5->nSize;
      iVar11 = 0;
      while (iVar11 < iVar3) {
        pPVar6 = (Pdr_Set_t *)Vec_PtrEntry(pVVar5,iVar11);
        iVar11 = iVar11 + 1;
        for (iVar10 = iVar11; iVar3 = pVVar5->nSize, iVar10 < iVar3; iVar10 = iVar10 + 1) {
          pPVar7 = (Pdr_Set_t *)Vec_PtrEntry(pVVar5,iVar10);
          iVar3 = Pdr_SetContains(pPVar7,pPVar6);
          if (iVar3 != 0) {
            Pdr_SetDeref(pPVar7);
            pvVar8 = Vec_PtrEntryLast(pVVar5);
            Vec_PtrWriteEntry(pVVar5,iVar10,pvVar8);
            Vec_PtrPop(pVVar5);
            iVar10 = iVar10 + -1;
          }
        }
      }
      aVar9 = Abc_Clock();
      p->tPush = p->tPush + (aVar9 - aVar4);
      return iVar1;
    }
    pVVar5 = Vec_VecEntry(p->vClauses,iVar3);
    Vec_PtrSort(pVVar5,p_Var12);
    i_00 = iVar3 + 1;
    p_00 = Vec_VecEntry(p->vClauses,i_00);
    for (iVar11 = 0; iVar11 < pVVar5->nSize; iVar11 = iVar11 + 1) {
      pPVar6 = (Pdr_Set_t *)Vec_PtrEntry(pVVar5,iVar11);
      iVar10 = iVar11;
LAB_004dbc77:
      iVar10 = iVar10 + 1;
      while (iVar10 < pVVar5->nSize) {
        pPVar7 = (Pdr_Set_t *)Vec_PtrEntry(pVVar5,iVar10);
        iVar2 = Pdr_SetContains(pPVar7,pPVar6);
        if (iVar2 == 0) goto LAB_004dbc77;
        Pdr_SetDeref(pPVar7);
        pvVar8 = Vec_PtrEntryLast(pVVar5);
        Vec_PtrWriteEntry(pVVar5,iVar10,pvVar8);
        Vec_PtrPop(pVVar5);
      }
      iVar10 = Pdr_ManCheckCube(p,iVar3,pPVar6,(Pdr_Set_t **)0x0,0,0,1);
      if (iVar10 != 0) {
        if (iVar10 == -1) {
          return -1;
        }
        pPVar7 = Pdr_ManReduceClause(p,iVar3,pPVar6);
        if (pPVar7 != (Pdr_Set_t *)0x0) {
          Pdr_SetDeref(pPVar6);
          pPVar6 = pPVar7;
        }
        Pdr_ManSolverAddClause(p,i_00,pPVar6);
        for (iVar10 = 0; iVar10 < p_00->nSize; iVar10 = iVar10 + 1) {
          pPVar7 = (Pdr_Set_t *)Vec_PtrEntry(p_00,iVar10);
          iVar2 = Pdr_SetContains(pPVar7,pPVar6);
          if (iVar2 != 0) {
            Pdr_SetDeref(pPVar7);
            pvVar8 = Vec_PtrEntryLast(p_00);
            Vec_PtrWriteEntry(p_00,iVar10,pvVar8);
            Vec_PtrPop(p_00);
            iVar10 = iVar10 + -1;
          }
        }
        Vec_PtrPush(p_00,pPVar6);
        pvVar8 = Vec_PtrEntryLast(pVVar5);
        Vec_PtrWriteEntry(pVVar5,iVar11,pvVar8);
        Vec_PtrPop(pVVar5);
        iVar11 = iVar11 + -1;
      }
    }
    if (pVVar5->nSize == 0) {
      iVar1 = 1;
    }
    p_Var12 = (_func_int_varargs *)(ulong)i_00;
  } while( true );
}

Assistant:

int Pdr_ManPushClauses( Pdr_Man_t * p )
{
    Pdr_Set_t * pTemp, * pCubeK, * pCubeK1;
    Vec_Ptr_t * vArrayK, * vArrayK1;
    int i, j, k, m, RetValue = 0, RetValue2, kMax = Vec_PtrSize(p->vSolvers)-1;
    int iStartFrame = p->pPars->fShiftStart ? p->iUseFrame : 1;
    int Counter = 0;
    abctime clk = Abc_Clock();
    assert( p->iUseFrame > 0 );
    Vec_VecForEachLevelStartStop( p->vClauses, vArrayK, k, iStartFrame, kMax )
    {
        Vec_PtrSort( vArrayK, (int (*)(void))Pdr_SetCompare );
        vArrayK1 = Vec_VecEntry( p->vClauses, k+1 );
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCubeK, j )
        {
            Counter++;

            // remove cubes in the same frame that are contained by pCubeK
            Vec_PtrForEachEntryStart( Pdr_Set_t *, vArrayK, pTemp, m, j+1 )
            {
                if ( !Pdr_SetContains( pTemp, pCubeK ) ) // pCubeK contains pTemp
                    continue;
                Pdr_SetDeref( pTemp );
                Vec_PtrWriteEntry( vArrayK, m, Vec_PtrEntryLast(vArrayK) );
                Vec_PtrPop(vArrayK);
                m--;
            }

            // check if the clause can be moved to the next frame
            RetValue2 = Pdr_ManCheckCube( p, k, pCubeK, NULL, 0, 0, 1 );
            if ( RetValue2 == -1 )
                return -1;
            if ( !RetValue2 )
                continue;

            {
                Pdr_Set_t * pCubeMin;
                pCubeMin = Pdr_ManReduceClause( p, k, pCubeK );
                if ( pCubeMin != NULL )
                {
//                Abc_Print( 1, "%d ", pCubeK->nLits - pCubeMin->nLits );
                    Pdr_SetDeref( pCubeK );
                    pCubeK = pCubeMin;
                }
            }

            // if it can be moved, add it to the next frame
            Pdr_ManSolverAddClause( p, k+1, pCubeK );
            // check if the clause subsumes others
            Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK1, pCubeK1, i )
            {
                if ( !Pdr_SetContains( pCubeK1, pCubeK ) ) // pCubeK contains pCubeK1
                    continue;
                Pdr_SetDeref( pCubeK1 );
                Vec_PtrWriteEntry( vArrayK1, i, Vec_PtrEntryLast(vArrayK1) );
                Vec_PtrPop(vArrayK1);
                i--;
            }
            // add the last clause
            Vec_PtrPush( vArrayK1, pCubeK );
            Vec_PtrWriteEntry( vArrayK, j, Vec_PtrEntryLast(vArrayK) );
            Vec_PtrPop(vArrayK);
            j--;
        }
        if ( Vec_PtrSize(vArrayK) == 0 )
            RetValue = 1;
    }

    // clean up the last one
    vArrayK = Vec_VecEntry( p->vClauses, kMax );
    Vec_PtrSort( vArrayK, (int (*)(void))Pdr_SetCompare );
    Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCubeK, j )
    {
        // remove cubes in the same frame that are contained by pCubeK
        Vec_PtrForEachEntryStart( Pdr_Set_t *, vArrayK, pTemp, m, j+1 )
        {
            if ( !Pdr_SetContains( pTemp, pCubeK ) ) // pCubeK contains pTemp
                continue;
/*
            Abc_Print( 1, "===\n" );
            Pdr_SetPrint( stdout, pCubeK, Aig_ManRegNum(p->pAig), NULL );
            Abc_Print( 1, "\n" );
            Pdr_SetPrint( stdout, pTemp, Aig_ManRegNum(p->pAig), NULL );
            Abc_Print( 1, "\n" );
*/
            Pdr_SetDeref( pTemp );
            Vec_PtrWriteEntry( vArrayK, m, Vec_PtrEntryLast(vArrayK) );
            Vec_PtrPop(vArrayK);
            m--;
        }
    }
    p->tPush += Abc_Clock() - clk;
    return RetValue;
}